

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrunsym.cpp
# Opt level: O1

void __thiscall
CVmRuntimeSymbols::add_sym(CVmRuntimeSymbols *this,char *sym,size_t len,vm_val_t *val)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_runtime_sym *pvVar3;
  vm_runtime_sym *pvVar4;
  
  pvVar3 = (vm_runtime_sym *)malloc(len + 0x57 & 0xfffffffffffffff8);
  uVar2 = *(undefined4 *)&val->field_0x4;
  aVar1 = val->val;
  (pvVar3->val).typ = val->typ;
  *(undefined4 *)&(pvVar3->val).field_0x4 = uVar2;
  (pvVar3->val).val = aVar1;
  pvVar3->len = len;
  pvVar3->sym = (char *)(pvVar3 + 1);
  memcpy(pvVar3 + 1,sym,len);
  pvVar3->macro_args = (char **)0x0;
  pvVar3->macro_flags = 0;
  pvVar3->nxt = (vm_runtime_sym *)0x0;
  pvVar3->macro_expansion = (char *)0x0;
  pvVar3->macro_exp_len = 0;
  pvVar3->macro_argc = 0;
  pvVar4 = this->tail_;
  if (this->tail_ == (vm_runtime_sym *)0x0) {
    pvVar4 = (vm_runtime_sym *)this;
  }
  pvVar4->nxt = pvVar3;
  this->tail_ = pvVar3;
  this->cnt_ = this->cnt_ + 1;
  return;
}

Assistant:

void CVmRuntimeSymbols::add_sym(const char *sym, size_t len,
                                const vm_val_t *val)
{
    vm_runtime_sym *new_sym;
    
    /* allocate a new structure */
    new_sym = (vm_runtime_sym *)t3malloc(osrndsz(
        sizeof(vm_runtime_sym) + len));

    /* copy the data */
    new_sym->val = *val;
    new_sym->len = len;
    memcpy(new_sym->sym = (char *)(new_sym + 1), sym, len);

    /* there are no macro parameters */
    new_sym->macro_expansion = 0;
    new_sym->macro_exp_len = 0;
    new_sym->macro_argc = 0;
    new_sym->macro_args = 0;
    new_sym->macro_flags = 0;

    /* link it into our list */
    new_sym->nxt = 0;
    if (tail_ == 0)
        head_ = new_sym;
    else
        tail_->nxt = new_sym;

    /* it's the new tail */
    tail_ = new_sym;

    /* count it */
    ++cnt_;
}